

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O0

bool __thiscall Game::put(Game *this,int x,int y,int freeput)

{
  bool bVar1;
  pair<int,_int> pVar2;
  int local_34;
  int iStack_30;
  pair<int,_int> koma;
  int temp2;
  int temp1;
  int freeput_local;
  int y_local;
  int x_local;
  Game *this_local;
  
  bVar1 = Boards::freeput(this->board,x,y,this->turn);
  if (bVar1) {
    this->turn = -this->turn;
    this->howturn = this->howturn + 1;
    bVar1 = Boards::isFull(this->board,this->turn);
    this->full = bVar1;
    pVar2 = Boards::Count(this->board);
    local_34 = pVar2.first;
    this->w = local_34;
    iStack_30 = pVar2.second;
    this->b = iStack_30;
    canPass(this);
    if ((this->w == 0) || (this->b == 0)) {
      this->full = true;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Game::put(int x, int y, int freeput){
	int temp1 = x, temp2 = y;
	if(board->freeput(temp1, temp2, turn)){
		turn *= -1;
		howturn++;
		full = board->isFull(turn);
		std::pair<int, int> koma(board->Count());
		w = koma.first;
		b = koma.second;
		canPass();
		if(w == 0 || b == 0)full = true;
		return true;
	}
	return false;
}